

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O1

conspage * next_conspage(void)

{
  uint uVar1;
  conspage *pcVar2;
  ulong uVar3;
  uint uVar4;
  LispPTR LVar5;
  conspage *pcVar6;
  conspage *pcVar7;
  
  pcVar2 = (conspage *)alloc_mdspage(5);
  pcVar2[0x20].field_0xa = 0xf8;
  pcVar7 = pcVar2 + 0x20;
  uVar1 = 0x100;
  uVar4 = 0xfc000000;
  do {
    uVar1 = uVar1 - 2;
    *(uint *)((long)&pcVar7->cell6 + (ulong)(uVar1 ^ 6) * 2) = uVar4 ^ 0x6000000;
    uVar4 = uVar4 + 0xfe000000;
  } while (10 < uVar1);
  pcVar2[0x21].next_page = 0;
  pcVar2[0x20].field_0xb = 0x7c;
  pcVar2[0x20].next_page = 0;
  if (((ulong)pcVar7 & 1) != 0) {
    printf("Misaligned pointer in LPageFromNative %p\n",pcVar7);
  }
  uVar3 = (long)pcVar7 - (long)Lisp_world;
  pcVar2->field_0xa = 0xf8;
  uVar1 = 0x100;
  uVar4 = 0xfc000000;
  do {
    uVar1 = uVar1 - 2;
    *(uint *)((long)&pcVar2->cell6 + (ulong)(uVar1 ^ 6) * 2) = uVar4 ^ 0x6000000;
    uVar4 = uVar4 + 0xfe000000;
  } while (10 < uVar1);
  pcVar2[1].next_page = 0;
  pcVar2->field_0xb = 0x7c;
  pcVar2->next_page = (LispPTR)(uVar3 >> 9);
  LVar5 = ListpDTD->dtd_nextpage;
  uVar1 = LVar5 + 1;
  if (uVar1 < 2) {
    pcVar6 = (conspage *)0x0;
  }
  else {
    do {
      uVar4 = LVar5 << 8;
      LVar5 = *(LispPTR *)(Lisp_world + (ulong)uVar4 + 6);
    } while (LVar5 - 1 < 0xfffffffe);
    pcVar6 = (conspage *)(Lisp_world + uVar4);
  }
  if (uVar1 < 2) {
    if (((ulong)pcVar2 & 1) != 0) {
      printf("Misaligned pointer in LPageFromNative %p\n",pcVar2);
    }
    ListpDTD->dtd_nextpage = (LispPTR)((ulong)((long)pcVar2 - (long)Lisp_world) >> 9);
  }
  else {
    if (((ulong)pcVar2 & 1) != 0) {
      printf("Misaligned pointer in LPageFromNative %p\n",pcVar2);
    }
    pcVar6->next_page = (LispPTR)((ulong)((long)pcVar2 - (long)Lisp_world) >> 9);
  }
  if (pcVar2[0x20].next_page != 0) {
    error("page2 has a next page??");
  }
  if (pcVar7 == pcVar6) {
    error("loop in conspage next_pages");
  }
  return pcVar2;
}

Assistant:

struct conspage *next_conspage(void) {
  struct conspage *page1; /* Allocated 1st MDS page */
  struct conspage *page2; /* Allocated 2nd MDS page */
  struct conspage *pg, *priorpg;
  LispPTR next, prior;

#ifdef NEWCDRCODING
  /* Allocate 2 conspages and get 1st page base */
  page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);
  /* Calculate next conspage's base address */
  page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

  init_conspage(page2, 0); /* No next page */
  init_conspage(page1, LPageFromNative(page2));

  priorpg = NULL;
  prior = 0;
  for (pg = (struct conspage *)NativeAligned4FromLPage(next = ListpDTD->dtd_nextpage);
       next && (next != CONSPAGE_LAST);
       pg = (struct conspage *)NativeAligned4FromLPage(next = pg->next_page)) {
    priorpg = pg;
    prior = next;
  }

  if (prior)
    priorpg->next_page = LPageFromNative(page1);
  else
    ListpDTD->dtd_nextpage = LPageFromNative(page1);

  if (page2->next_page) error("page2 has a next page??");
  if (page2 == priorpg) error("loop in conspage next_pages");
#else
  for (next = (int)ListpDTD->dtd_nextpage; /* /!\ Note no exit condition /!\ */ /* get next free conspage */
       ; ListpDTD->dtd_nextpage = next = page1->next_page, page1->next_page = 0xffff) {
    if (next == 0) {
      /* Allocate 2 conspages and get 1st page base */
      page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);

      /* Calculate next conspage's base address */
      page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

      /* XXX: why is the link for page2's next here?
       * when it was previously commented as "Doesn't exist next page"
       */
      init_conspage(page2, ListpDTD->dtd_nextpage);
      init_conspage(page1, LPageFromNative(page2));

      ListpDTD->dtd_nextpage = LPageFromNative(page1);
      goto ex; /* replaced break */
    } else {
      page1 = (struct conspage *)NativeAligned4FromLPage(next); /*Jan-21*/
    }

    if (page1->count > 1) break;

  } /* for loop end */
#endif /* NEWCDRCODING */
ex:
  return (page1);
}